

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDVertexEdgeProperties * __thiscall
ON_SubDVertex::EdgeProperties
          (ON_SubDVertexEdgeProperties *__return_storage_ptr__,ON_SubDVertex *this)

{
  char cVar1;
  ushort uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  ushort uVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  ulong uVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  unsigned_short uVar12;
  ulong uVar13;
  bool bVar14;
  unsigned_short uVar15;
  unsigned_short uVar16;
  ushort uVar17;
  
  __return_storage_ptr__->m_null_edge_count = 0;
  __return_storage_ptr__->m_edge_count = 0;
  __return_storage_ptr__->m_face_count = 0;
  __return_storage_ptr__->m_unset_edge_count = 0;
  __return_storage_ptr__->m_smooth_edge_count = 0;
  __return_storage_ptr__->m_crease_edge_count = 0;
  __return_storage_ptr__->m_wire_edge_count = 0;
  __return_storage_ptr__->m_boundary_edge_count = 0;
  __return_storage_ptr__->m_interior_edge_count = 0;
  __return_storage_ptr__->m_nonmanifold_edge_count = 0;
  __return_storage_ptr__->m_min_edge_face_count = 0;
  __return_storage_ptr__->m_max_edge_face_count = 0;
  uVar2 = this->m_edge_count;
  __return_storage_ptr__->m_edge_count = uVar2;
  __return_storage_ptr__->m_face_count = this->m_face_count;
  uVar6 = __return_storage_ptr__->m_null_edge_count;
  if ((ulong)uVar2 != 0) {
    uVar3 = __return_storage_ptr__->m_unset_edge_count;
    uVar7 = __return_storage_ptr__->m_smooth_edge_count;
    uVar8 = __return_storage_ptr__->m_crease_edge_count;
    uVar16 = __return_storage_ptr__->m_min_edge_face_count;
    uVar15 = __return_storage_ptr__->m_max_edge_face_count;
    uVar4 = __return_storage_ptr__->m_interior_edge_count;
    uVar10 = __return_storage_ptr__->m_boundary_edge_count;
    uVar11 = __return_storage_ptr__->m_wire_edge_count;
    uVar12 = __return_storage_ptr__->m_nonmanifold_edge_count;
    bVar14 = true;
    uVar13 = 0;
    do {
      uVar9 = this->m_edges[uVar13].m_ptr & 0xfffffffffffffff8;
      if (uVar9 == 0) {
        uVar6 = uVar6 + 1;
      }
      else {
        cVar1 = *(char *)(uVar9 + 0x60);
        if ((cVar1 == '\x01') || (cVar1 == '\x04')) {
          uVar7 = uVar7 + 1;
        }
        else if (cVar1 == '\x02') {
          uVar8 = uVar8 + 1;
        }
        else {
          uVar3 = uVar3 + 1;
        }
        uVar5 = *(ushort *)(uVar9 + 100);
        uVar17 = uVar5;
        if (bVar14) {
          bVar14 = false;
          uVar15 = uVar5;
        }
        else if ((uVar16 <= uVar5) && (uVar17 = uVar16, uVar15 < uVar5)) {
          uVar15 = uVar5;
        }
        uVar16 = uVar17;
        if (uVar5 == 2) {
          uVar4 = uVar4 + 1;
        }
        else if (uVar5 == 1) {
          uVar10 = uVar10 + 1;
        }
        else if (uVar5 == 0) {
          uVar11 = uVar11 + 1;
        }
        else {
          uVar12 = uVar12 + 1;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar2 != uVar13);
    __return_storage_ptr__->m_smooth_edge_count = uVar7;
    __return_storage_ptr__->m_crease_edge_count = uVar8;
    __return_storage_ptr__->m_unset_edge_count = uVar3;
    __return_storage_ptr__->m_min_edge_face_count = uVar16;
    __return_storage_ptr__->m_max_edge_face_count = uVar15;
    __return_storage_ptr__->m_interior_edge_count = uVar4;
    __return_storage_ptr__->m_boundary_edge_count = uVar10;
    __return_storage_ptr__->m_wire_edge_count = uVar11;
    __return_storage_ptr__->m_nonmanifold_edge_count = uVar12;
  }
  __return_storage_ptr__->m_null_edge_count = uVar6;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDVertexEdgeProperties ON_SubDVertex::EdgeProperties() const
{
  ON_SubDVertexEdgeProperties ep;

  ep.m_edge_count = m_edge_count;
  ep.m_face_count = m_face_count;

  bool bFirstEdge = true;
  for (unsigned short vei = 0; vei < ep.m_edge_count; vei++)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
    {
      ep.m_null_edge_count++;
      continue;
    }

    if (e->IsCrease())
      ep.m_crease_edge_count++;
    else if (e->IsSmooth())
      ep.m_smooth_edge_count++;
    else
      ep.m_unset_edge_count++;

    const unsigned short edge_face_count = e->m_face_count;
    if (bFirstEdge)
    {
      bFirstEdge = false;
      ep.m_min_edge_face_count = edge_face_count;
      ep.m_max_edge_face_count = edge_face_count;
    }
    else if (edge_face_count < ep.m_min_edge_face_count)
      ep.m_min_edge_face_count = edge_face_count;
    else if (edge_face_count > ep.m_max_edge_face_count)
      ep.m_max_edge_face_count = edge_face_count;

    if (0 == edge_face_count)
      ep.m_wire_edge_count++;
    else if (1 == edge_face_count)
      ep.m_boundary_edge_count++;
    else if (2 == edge_face_count)
      ep.m_interior_edge_count++;
    else
      ep.m_nonmanifold_edge_count++;

  }
  return ep;
}